

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  int32_t iVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  int iVar12;
  IdxElement *pIVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  fpclass_type *pfVar17;
  uint uVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  byte bVar28;
  cpp_dec_float<200U,_int,_void> local_848;
  uint local_7c8 [28];
  type t;
  IdxElement local_6d8;
  IdxElement local_654;
  IdxElement local_5d0;
  IdxElement local_54c;
  IdxElement local_4c8;
  IdxElement local_444;
  IdxElement local_3c0;
  IdxElement local_33c;
  IdxElement local_2b8;
  IdxElement local_234;
  IdxElement local_1b0;
  IdxElement local_12c;
  uint local_a8 [30];
  
  bVar28 = 0;
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  uVar24 = end - 1;
  if ((int)uVar24 <= start2 + size) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,end,compare,start2,type);
    return uVar24;
  }
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  iVar14 = (int)(start2 + uVar24) / 2;
  pIVar1 = keys + iVar14;
  pIVar13 = keys + iVar14;
  pnVar23 = &pIVar13->val;
  iVar14 = pIVar13->idx;
  pnVar20 = pnVar23;
  puVar21 = local_7c8;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar21 = (pnVar20->m_backend).data._M_elems[0];
    pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((pnVar20->m_backend).data._M_elems + 1);
    puVar21 = puVar21 + 1;
  }
  iVar5 = (pIVar13->val).m_backend.exp;
  bVar3 = (pIVar13->val).m_backend.neg;
  fVar6 = (pIVar13->val).m_backend.fpclass;
  iVar7 = (pIVar13->val).m_backend.prec_elem;
  lVar15 = (long)start2;
  uVar25 = uVar24;
  uVar18 = start2;
  do {
    uVar26 = (ulong)uVar25;
    if (type) {
      if ((int)uVar18 < (int)uVar24) {
        pfVar17 = &keys[(int)uVar18].val.m_backend.fpclass;
        lVar27 = 0;
        do {
          local_12c.idx = pfVar17[-0x1f];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)(pfVar17 + -0x1e);
          pnVar20 = &local_12c.val;
          for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar28 * -8 + 4);
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_12c.val.m_backend.exp = pfVar17[-2];
          local_12c.val.m_backend.neg = *(bool *)(pfVar17 + -1);
          local_12c.val.m_backend._120_8_ = *(undefined8 *)pfVar17;
          local_444.idx = iVar14;
          puVar21 = local_7c8;
          pnVar20 = &local_444.val;
          for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_444.val.m_backend.exp = iVar5;
          local_444.val.m_backend.neg = bVar3;
          local_444.val.m_backend.fpclass = fVar6;
          local_444.val.m_backend.prec_elem = iVar7;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_848,compare,&local_12c,&local_444);
          if (local_848.fpclass == cpp_dec_float_NaN) {
            uVar18 = uVar18 - (int)lVar27;
            goto LAB_005ab65c;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_848,&t.m_backend);
          if (-1 < iVar12) {
            uVar18 = uVar18 - (int)lVar27;
            goto LAB_005ab65c;
          }
          lVar27 = lVar27 + -1;
          pfVar17 = pfVar17 + 0x21;
        } while ((long)(int)uVar18 - (long)(int)uVar24 != lVar27);
        uVar18 = uVar18 - (int)lVar27;
      }
LAB_005ab65c:
      if (start2 < (int)uVar25) {
        uVar26 = (ulong)(int)uVar25;
        pfVar17 = &keys[uVar26].val.m_backend.fpclass;
        do {
          local_1b0.idx = pfVar17[-0x1f];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)(pfVar17 + -0x1e);
          pnVar20 = &local_1b0.val;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar28 * -8 + 4);
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_1b0.val.m_backend.exp = pfVar17[-2];
          local_1b0.val.m_backend.neg = *(bool *)(pfVar17 + -1);
          local_1b0.val.m_backend._120_8_ = *(undefined8 *)pfVar17;
          local_4c8.idx = iVar14;
          puVar21 = local_7c8;
          pnVar20 = &local_4c8.val;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_4c8.val.m_backend.exp = iVar5;
          local_4c8.val.m_backend.neg = bVar3;
          local_4c8.val.m_backend.fpclass = fVar6;
          local_4c8.val.m_backend.prec_elem = iVar7;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_848,compare,&local_1b0,&local_4c8);
          if (local_848.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_848,&t.m_backend);
          if (iVar12 < 0) break;
          uVar26 = uVar26 - 1;
          pfVar17 = pfVar17 + -0x21;
        } while (lVar15 < (long)uVar26);
      }
    }
    else {
      if ((int)uVar18 < (int)uVar24) {
        pfVar17 = &keys[(int)uVar18].val.m_backend.fpclass;
        do {
          local_234.idx = pfVar17[-0x1f];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)(pfVar17 + -0x1e);
          pnVar20 = &local_234.val;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar28 * -8 + 4);
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_234.val.m_backend.exp = pfVar17[-2];
          local_234.val.m_backend.neg = *(bool *)(pfVar17 + -1);
          local_234.val.m_backend._120_8_ = *(undefined8 *)pfVar17;
          local_54c.idx = iVar14;
          puVar21 = local_7c8;
          pnVar20 = &local_54c.val;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_54c.val.m_backend.exp = iVar5;
          local_54c.val.m_backend.neg = bVar3;
          local_54c.val.m_backend.fpclass = fVar6;
          local_54c.val.m_backend.prec_elem = iVar7;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_848,compare,&local_234,&local_54c);
          if (local_848.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_848,&t.m_backend);
          if (0 < iVar12) break;
          uVar18 = uVar18 + 1;
          pfVar17 = pfVar17 + 0x21;
        } while (uVar24 != uVar18);
      }
      if (start2 < (int)uVar25) {
        uVar26 = (ulong)(int)uVar25;
        pfVar17 = &keys[uVar26].val.m_backend.fpclass;
        do {
          local_2b8.idx = pfVar17[-0x1f];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)(pfVar17 + -0x1e);
          pnVar20 = &local_2b8.val;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar28 * -8 + 4);
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_2b8.val.m_backend.exp = pfVar17[-2];
          local_2b8.val.m_backend.neg = *(bool *)(pfVar17 + -1);
          local_2b8.val.m_backend._120_8_ = *(undefined8 *)pfVar17;
          local_5d0.idx = iVar14;
          puVar21 = local_7c8;
          pnVar20 = &local_5d0.val;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar20->m_backend).data._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_5d0.val.m_backend.exp = iVar5;
          local_5d0.val.m_backend.neg = bVar3;
          local_5d0.val.m_backend.fpclass = fVar6;
          local_5d0.val.m_backend.prec_elem = iVar7;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_848,compare,&local_2b8,&local_5d0);
          if (local_848.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_848,&t.m_backend);
          if (iVar12 < 1) break;
          uVar26 = uVar26 - 1;
          pfVar17 = pfVar17 + -0x21;
        } while (lVar15 < (long)uVar26);
      }
    }
    uVar25 = (uint)uVar26;
    if ((int)uVar25 <= (int)uVar18) break;
    pIVar13 = keys + (int)uVar18;
    iVar12 = pIVar13->idx;
    pnVar20 = &pIVar13->val;
    puVar21 = local_a8;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar21 = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + (ulong)bVar28 * -8 + 4);
      puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
    }
    iVar8 = (pIVar13->val).m_backend.exp;
    bVar4 = (pIVar13->val).m_backend.neg;
    pIVar2 = keys + (int)uVar25;
    pIVar13->idx = pIVar2->idx;
    pnVar20 = &pIVar2->val;
    pnVar22 = &pIVar13->val;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar22->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + (ulong)bVar28 * -8 + 4);
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + (ulong)bVar28 * -8 + 4);
    }
    (pIVar13->val).m_backend.exp = (pIVar2->val).m_backend.exp;
    (pIVar13->val).m_backend.neg = (pIVar2->val).m_backend.neg;
    pIVar2->idx = iVar12;
    puVar21 = local_a8;
    pnVar20 = &pIVar2->val;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = *puVar21;
      puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + (ulong)bVar28 * -8 + 4);
    }
    (pIVar2->val).m_backend.exp = iVar8;
    (pIVar2->val).m_backend.neg = bVar4;
    fVar10 = (pIVar13->val).m_backend.fpclass;
    iVar11 = (pIVar13->val).m_backend.prec_elem;
    iVar9 = (pIVar2->val).m_backend.prec_elem;
    (pIVar13->val).m_backend.fpclass = (pIVar2->val).m_backend.fpclass;
    (pIVar13->val).m_backend.prec_elem = iVar9;
    (pIVar2->val).m_backend.fpclass = fVar10;
    (pIVar2->val).m_backend.prec_elem = iVar11;
    uVar18 = uVar18 + 1;
    uVar25 = uVar25 - 1;
  } while( true );
  if (type) {
    if ((int)uVar18 < (int)uVar24) {
      pfVar17 = &keys[(int)uVar18].val.m_backend.fpclass;
      do {
        local_654.idx = iVar14;
        puVar21 = local_7c8;
        pnVar20 = &local_654.val;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar20->m_backend).data._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        local_33c.idx = pfVar17[-0x1f];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)(pfVar17 + -0x1e);
        pnVar20 = &local_33c.val;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar28 * -8 + 4);
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        local_33c.val.m_backend.exp = pfVar17[-2];
        local_33c.val.m_backend.neg = *(bool *)(pfVar17 + -1);
        local_33c.val.m_backend._120_8_ = *(undefined8 *)pfVar17;
        local_654.val.m_backend.exp = iVar5;
        local_654.val.m_backend.neg = bVar3;
        local_654.val.m_backend.fpclass = fVar6;
        local_654.val.m_backend.prec_elem = iVar7;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_848,compare,&local_654,&local_33c);
        if (local_848.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_848,&t.m_backend);
        if (iVar12 < 0) break;
        uVar18 = uVar18 + 1;
        pfVar17 = pfVar17 + 0x21;
      } while (uVar24 != uVar18);
    }
    if (uVar18 == start2) {
      pIVar13 = keys + (int)uVar18;
      iVar14 = pIVar13->idx;
      pnVar20 = &pIVar13->val;
      puVar21 = local_a8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar21 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar28 * -8 + 4);
        puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
      }
      iVar5 = (pIVar13->val).m_backend.exp;
      bVar3 = (pIVar13->val).m_backend.neg;
      pIVar13->idx = pIVar1->idx;
      pnVar20 = pnVar23;
      pnVar22 = &pIVar13->val;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar28 * -8 + 4);
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + (ulong)bVar28 * -8 + 4);
      }
      (pIVar13->val).m_backend.exp = (pIVar1->val).m_backend.exp;
      (pIVar13->val).m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar14;
      puVar21 = local_a8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = *puVar21;
        puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + (ulong)bVar28 * -8 + 4);
      }
      (pIVar1->val).m_backend.exp = iVar5;
      (pIVar1->val).m_backend.neg = bVar3;
      fVar6 = (pIVar13->val).m_backend.fpclass;
      iVar9 = (pIVar13->val).m_backend.prec_elem;
      iVar7 = (pIVar1->val).m_backend.prec_elem;
      (pIVar13->val).m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      (pIVar13->val).m_backend.prec_elem = iVar7;
      (pIVar1->val).m_backend.fpclass = fVar6;
      (pIVar1->val).m_backend.prec_elem = iVar9;
      uVar18 = uVar18 + 1;
    }
  }
  else {
    if (start2 < (int)uVar25) {
      uVar26 = (ulong)(int)uVar25;
      pfVar17 = &keys[uVar26].val.m_backend.fpclass;
      do {
        local_6d8.idx = iVar14;
        puVar21 = local_7c8;
        pnVar20 = &local_6d8.val;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar20->m_backend).data._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        local_3c0.idx = pfVar17[-0x1f];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)(pfVar17 + -0x1e);
        pnVar20 = &local_3c0.val;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar28 * -8 + 4);
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        local_3c0.val.m_backend.exp = pfVar17[-2];
        local_3c0.val.m_backend.neg = *(bool *)(pfVar17 + -1);
        local_3c0.val.m_backend._120_8_ = *(undefined8 *)pfVar17;
        local_6d8.val.m_backend.exp = iVar5;
        local_6d8.val.m_backend.neg = bVar3;
        local_6d8.val.m_backend.fpclass = fVar6;
        local_6d8.val.m_backend.prec_elem = iVar7;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_848,compare,&local_6d8,&local_3c0);
        if (local_848.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_848,&t.m_backend);
        if (0 < iVar12) break;
        uVar26 = uVar26 - 1;
        pfVar17 = pfVar17 + -0x21;
      } while (lVar15 < (long)uVar26);
    }
    uVar25 = (uint)uVar26;
    if (uVar25 == uVar24) {
      pIVar13 = keys + (int)uVar25;
      iVar14 = pIVar13->idx;
      pnVar20 = &pIVar13->val;
      puVar21 = local_a8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar21 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar28 * -8 + 4);
        puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
      }
      iVar5 = (pIVar13->val).m_backend.exp;
      bVar3 = (pIVar13->val).m_backend.neg;
      pIVar13->idx = pIVar1->idx;
      pnVar20 = pnVar23;
      pnVar22 = &pIVar13->val;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar28 * -8 + 4);
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + (ulong)bVar28 * -8 + 4);
      }
      (pIVar13->val).m_backend.exp = (pIVar1->val).m_backend.exp;
      (pIVar13->val).m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar14;
      puVar21 = local_a8;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = *puVar21;
        puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + (ulong)bVar28 * -8 + 4);
      }
      (pIVar1->val).m_backend.exp = iVar5;
      (pIVar1->val).m_backend.neg = bVar3;
      fVar6 = (pIVar13->val).m_backend.fpclass;
      iVar9 = (pIVar13->val).m_backend.prec_elem;
      iVar7 = (pIVar1->val).m_backend.prec_elem;
      (pIVar13->val).m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      (pIVar13->val).m_backend.prec_elem = iVar7;
      (pIVar1->val).m_backend.fpclass = fVar6;
      (pIVar1->val).m_backend.prec_elem = iVar9;
      uVar25 = uVar25 - 1;
    }
  }
  if ((int)(uVar25 - start2) < size * 2) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,uVar25 + 1,compare,start2,!type);
    if (size <= (int)(uVar18 - start2)) {
      return uVar18 - 1;
    }
    size = (start2 + size) - uVar18;
    start2 = uVar18;
  }
  else {
    end = uVar25 + 1;
  }
  iVar14 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,compare,start,end,size,start2,end2,!type);
  return iVar14;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}